

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_arithmetic.c
# Opt level: O0

void over_dsp(t_over *x,t_signal **sp)

{
  t_signal **sp_local;
  t_over *x_local;
  
  if (((*sp)->s_n & 7U) == 0) {
    dsp_add(over_perf8,4,(*sp)->s_vec,sp[1]->s_vec,sp[2]->s_vec,(long)(*sp)->s_n,sp,x);
  }
  else {
    dsp_add(over_perform,4,(*sp)->s_vec,sp[1]->s_vec,sp[2]->s_vec,(long)(*sp)->s_n,sp,x);
  }
  return;
}

Assistant:

static void over_dsp(t_over *x, t_signal **sp)
{
    if (sp[0]->s_n&7)
        dsp_add(over_perform, 4,
            sp[0]->s_vec, sp[1]->s_vec, sp[2]->s_vec, (t_int)sp[0]->s_n);
    else
        dsp_add(over_perf8, 4,
            sp[0]->s_vec, sp[1]->s_vec, sp[2]->s_vec, (t_int)sp[0]->s_n);
}